

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void __thiscall
option::PrintUsageImplementation::LinePartIterator::update_length(LinePartIterator *this)

{
  int iVar1;
  bool bVar2;
  uint local_14;
  uint mask;
  uint ch;
  LinePartIterator *this_local;
  
  this->screenlen = 0;
  this->len = 0;
  while( true ) {
    bVar2 = false;
    if (((this->ptr[this->len] != '\0') && (bVar2 = false, this->ptr[this->len] != '\v')) &&
       (bVar2 = false, this->ptr[this->len] != '\t')) {
      bVar2 = this->ptr[this->len] != '\n';
    }
    if (!bVar2) break;
    this->screenlen = this->screenlen + 1;
    local_14 = (uint)(byte)this->ptr[this->len];
    if (0xc1 < local_14) {
      iVar1 = 0x1f;
      if ((local_14 ^ 0xff) != 0) {
        for (; (local_14 ^ 0xff) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      local_14 = local_14 & 0xffffffffU >> (((byte)iVar1 ^ 0x1f) & 0x1f);
      while ((byte)(this->ptr[this->len + 1] ^ 0x80U) < 0x40) {
        local_14 = local_14 << 6 ^ (uint)(byte)this->ptr[this->len + 1] ^ 0x80;
        this->len = this->len + 1;
      }
      if ((0x10ff < local_14) && (bVar2 = isWideChar(local_14), bVar2)) {
        this->screenlen = this->screenlen + 1;
      }
    }
    this->len = this->len + 1;
  }
  return;
}

Assistant:

void update_length()
    {
      screenlen = 0;
      for (len = 0; ptr[len] != 0 && ptr[len] != '\v' && ptr[len] != '\t' && ptr[len] != '\n'; ++len)
      {
        ++screenlen;
        unsigned ch = static_cast<unsigned char>(ptr[len]);
        if (ch > 0xC1) // everything <= 0xC1 (yes, even 0xC1 itself) is not a valid UTF-8 start byte
        {
          // int __builtin_clz (unsigned int x)
          // Returns the number of leading 0-bits in x, starting at the most significant bit
          unsigned mask = static_cast<unsigned>(-1) >> __builtin_clz(ch ^ 0xff);
          ch = ch & mask; // mask out length bits, we don't verify their correctness
          while ((static_cast<unsigned char>(ptr[len + 1]) ^ 0x80) <= 0x3F) // while next byte is continuation byte
          {
            ch = (ch << 6) ^ static_cast<unsigned char>(ptr[len + 1]) ^ 0x80; // add continuation to char code
            ++len;
          }
          // ch is the decoded unicode code point
          if (ch >= 0x1100 && isWideChar(ch)) // the test for 0x1100 is here to avoid the function call in the Latin case
            ++screenlen;
        }
      }
    }